

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::Option_group::add_subcommand(Option_group *this,App *subcom)

{
  App_p subc;
  undefined1 local_38 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  App::get_subcommand_ptr((App *)local_38,subcom->parent_);
  App::remove_subcommand(*(App **)(local_38._0_8_ + 0x308),subcom);
  local_38._16_8_ = local_38._0_8_;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
  local_38._0_8_ = (_func_int **)0x0;
  local_38._8_8_ = (pointer)0x0;
  App::add_subcommand(&this->super_App,(App_p *)(local_38 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return subcom;
}

Assistant:

App *add_subcommand(App *subcom) {
        App_p subc = subcom->get_parent()->get_subcommand_ptr(subcom);
        subc->get_parent()->remove_subcommand(subcom);
        add_subcommand(std::move(subc));
        return subcom;
    }